

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseCharDataComplex(xmlParserCtxtPtr ctxt,int partial)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint int1;
  int iVar4;
  xmlParserInputPtr pxVar5;
  xmlChar *pxVar6;
  uint uVar7;
  int l;
  xmlChar buf [305];
  int local_16c;
  xmlChar local_168 [312];
  
  int1 = xmlCurrentChar(ctxt,&local_16c);
  if (int1 == 0x200000) {
    int1 = 0xfffd;
  }
  uVar7 = 0;
  while (((int1 != 0x26 && (int1 != 0x3c)) &&
         ((partial == 0 || ((int1 != 0x5d || (1 < (long)ctxt->input->end - (long)ctxt->input->cur)))
          )))) {
    if ((int)int1 < 0x100) {
      if ((0xd < int1) || ((0x2600U >> (int1 & 0x1f) & 1) == 0)) {
        bVar3 = 0x1f < (int)int1;
        goto LAB_00141aaa;
      }
    }
    else {
      bVar3 = (int1 - 0x10000 < 0x100000 || int1 - 0xe000 < 0x1ffe) || (int)int1 < 0xd800;
LAB_00141aaa:
      if (!bVar3) break;
      if (((int1 == 0x5d) && (pxVar6 = ctxt->input->cur, pxVar6[1] == ']')) && (pxVar6[2] == '>')) {
        xmlFatalErr(ctxt,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
      }
    }
    if ((int)int1 < 0x80) {
      local_168[(int)uVar7] = (xmlChar)int1;
      uVar7 = uVar7 + 1;
    }
    else {
      iVar4 = xmlCopyCharMultiByte(local_168 + (int)uVar7,int1);
      uVar7 = uVar7 + iVar4;
    }
    pxVar5 = ctxt->input;
    if (*pxVar5->cur == '\n') {
      pxVar5->line = pxVar5->line + 1;
      pxVar5->col = 1;
    }
    else {
      pxVar5->col = pxVar5->col + 1;
    }
    pxVar5->cur = pxVar5->cur + local_16c;
    if (299 < (int)uVar7) {
      local_168[uVar7] = '\0';
      xmlCharacters(ctxt,local_168,uVar7);
      uVar7 = 0;
      if ((ctxt->input->flags & 0x40) == 0) {
        xmlParserShrink(ctxt);
      }
    }
    int1 = xmlCurrentChar(ctxt,&local_16c);
    if (int1 == 0x200000) {
      int1 = 0xfffd;
    }
  }
  if (uVar7 != 0) {
    local_168[(int)uVar7] = '\0';
    xmlCharacters(ctxt,local_168,uVar7);
  }
  pbVar2 = ctxt->input->cur;
  if (ctxt->input->end <= pbVar2) {
    return;
  }
  uVar7 = int1 - 0x26;
  if ((uVar7 < 0x38) && ((0x80000000400001U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
    return;
  }
  if (int1 == 0) {
    bVar1 = *pbVar2;
    if (bVar1 != 0) {
      if (partial != 0) {
        return;
      }
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_INVALID_CHAR,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(uint)bVar1,
                 "Incomplete UTF-8 sequence starting with %02X\n",(uint)bVar1);
      pxVar5 = ctxt->input;
      if (*pxVar5->cur == '\n') {
        pxVar5->line = pxVar5->line + 1;
        pxVar5->col = 1;
      }
      else {
        pxVar5->col = pxVar5->col + 1;
      }
      pxVar6 = pxVar5->cur + 1;
      goto LAB_00141cab;
    }
    if ((uVar7 < 0x38) && ((0x80000000400001U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
      return;
    }
  }
  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_INVALID_CHAR,XML_ERR_FATAL,(xmlChar *)0x0,
             (xmlChar *)0x0,(xmlChar *)0x0,int1,"PCDATA invalid Char value %d\n",int1);
  pxVar5 = ctxt->input;
  if (*pxVar5->cur == '\n') {
    pxVar5->line = pxVar5->line + 1;
    pxVar5->col = 1;
  }
  else {
    pxVar5->col = pxVar5->col + 1;
  }
  pxVar6 = pxVar5->cur + local_16c;
LAB_00141cab:
  pxVar5->cur = pxVar6;
  return;
}

Assistant:

static void
xmlParseCharDataComplex(xmlParserCtxtPtr ctxt, int partial) {
    xmlChar buf[XML_PARSER_BIG_BUFFER_SIZE + 5];
    int nbchar = 0;
    int cur, l;

    cur = xmlCurrentCharRecover(ctxt, &l);
    while ((cur != '<') && /* checked */
           (cur != '&') &&
           ((!partial) || (cur != ']') ||
            (ctxt->input->end - ctxt->input->cur >= 2)) &&
	   (IS_CHAR(cur))) {
	if ((cur == ']') && (NXT(1) == ']') && (NXT(2) == '>')) {
	    xmlFatalErr(ctxt, XML_ERR_MISPLACED_CDATA_END, NULL);
	}
	COPY_BUF(buf, nbchar, cur);
	/* move current position before possible calling of ctxt->sax->characters */
	NEXTL(l);
	if (nbchar >= XML_PARSER_BIG_BUFFER_SIZE) {
	    buf[nbchar] = 0;

            xmlCharacters(ctxt, buf, nbchar);
	    nbchar = 0;
            SHRINK;
	}
	cur = xmlCurrentCharRecover(ctxt, &l);
    }
    if (nbchar != 0) {
        buf[nbchar] = 0;

        xmlCharacters(ctxt, buf, nbchar);
    }
    /*
     * cur == 0 can mean
     *
     * - End of buffer.
     * - An actual 0 character.
     * - An incomplete UTF-8 sequence. This is allowed if partial is set.
     */
    if (ctxt->input->cur < ctxt->input->end) {
        if ((cur == 0) && (CUR != 0)) {
            if (partial == 0) {
                xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                        "Incomplete UTF-8 sequence starting with %02X\n", CUR);
                NEXTL(1);
            }
        } else if ((cur != '<') && (cur != '&') && (cur != ']')) {
            /* Generate the error and skip the offending character */
            xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                              "PCDATA invalid Char value %d\n", cur);
            NEXTL(l);
        }
    }
}